

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

double NEST::NESTcalc::GetDriftVelocity_MagBoltz
                 (double temperature,double density,double efieldinput,double pressure,
                 double molarMass)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar1) {
    dVar6 = (efieldinput / (density * 1.5074949684589966e+22)) * 1e+17;
    dVar2 = pow(1.00113657,1.0 / dVar6);
    dVar6 = pow(dVar6,0.2570253);
    dVar6 = dVar6 * dVar2 * 2.991205;
  }
  else {
    dVar2 = efieldinput / ((6.0221409e+23 / molarMass) * density);
    dVar6 = (double)(-(ulong)(dVar2 < 1.2e-19) & -(ulong)(0.0 <= dVar2) & (ulong)(dVar2 * 4e+22));
    if ((dVar2 < 3.5e-19) && (1.2e-19 <= dVar2)) {
      dVar6 = pow(dVar2,0.518110447340587);
      dVar6 = pow(dVar2,dVar6 * -357384143.004642);
      dVar6 = dVar6 * 395.50266631436;
    }
    if ((dVar2 < 3.8e-17) && (3.5e-19 <= dVar2)) {
      dVar6 = log(dVar2 * 1008.30998933704);
      dVar3 = pow(dVar6,3.0);
      dVar4 = pow(dVar6,4.0);
      dVar5 = exp(dVar2);
      dVar6 = dVar5 * 223.711221224885 *
              (dVar4 * -0.990440443390298 +
              dVar3 * -115.157545835228 +
              dVar6 * dVar6 * -4911.83213989609 + dVar6 * -90261.9643716643 + -592981.611357632);
    }
    dVar6 = ABS((double)(~-(ulong)(dVar2 < 3.8e-17) & (ulong)(dVar2 * 6e+21 + -32279.0) |
                        (ulong)dVar6 & -(ulong)(dVar2 < 3.8e-17))) * 1e-05;
  }
  return dVar6;
}

Assistant:

double NESTcalc::GetDriftVelocity_MagBoltz(double temperature,
					   double density, double efieldinput, double pressure,
    double molarMass)  // Nichole Barry UCD 2011
{
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
    molarMass = 39.948;
    density *= NEST_AVO / molarMass;
    double edrift = 0., gasdep = efieldinput / density;
    edrift = 2.991205 * pow(1.00113657, 1. / (gasdep * 1.e17)) *
             pow(gasdep * 1.e17, 0.2570253);
    return edrift;
  }
  // Gas equation one coefficients (E/N of 1.2E-19 to 3.5E-19)
  density *= NEST_AVO / molarMass;
  double gas1a = 395.50266631436, gas1b = -357384143.004642,
         gas1c = 0.518110447340587;
  // Gas equation two coefficients (E/N of 3.5E-19 to 3.8E-17)
  double gas2a = -592981.611357632, gas2b = -90261.9643716643,
         gas2c = -4911.83213989609, gas2d = -115.157545835228,
         gas2f = -0.990440443390298, gas2g = 1008.30998933704,
         gas2h = 223.711221224885;
  double edrift = 0., gasdep = efieldinput / density, gas1fix = 0.,
         gas2fix = 0.;

  if (gasdep < 1.2e-19 && gasdep >= 0.) edrift = 4e22 * gasdep;
  if (gasdep < 3.5e-19 && gasdep >= 1.2e-19) {
    gas1fix = gas1b * pow(gasdep, gas1c);
    edrift = gas1a * pow(gasdep, gas1fix);
  }
  if (gasdep < 3.8e-17 && gasdep >= 3.5e-19) {
    gas2fix = log(gas2g * gasdep);
    edrift = (gas2a + gas2b * gas2fix + gas2c * pow(gas2fix, 2.) +
              gas2d * pow(gas2fix, 3.) + gas2f * pow(gas2fix, 4.)) *
             (gas2h * exp(gasdep));
  }
  if (gasdep >= 3.8e-17) edrift = 6e21 * gasdep - 32279.;

  return std::abs(edrift) * 1e-5;  // from cm/s into mm per microsecond
}